

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.h
# Opt level: O2

void __thiscall
VmBlock::VmBlock(VmBlock *this,Allocator *allocator,SynBase *source,InplaceStr name,uint uniqueId)

{
  VmValue::VmValue(&this->super_VmValue,3,allocator,(VmType)ZEXT816(0x400000004),source);
  (this->super_VmValue)._vptr_VmValue = (_func_int **)&PTR__VmBlock_003e5d00;
  (this->name).begin = name.begin;
  (this->name).end = name.end;
  this->uniqueId = uniqueId;
  (this->predecessors).allocator = allocator;
  (this->predecessors).data = (this->predecessors).little;
  (this->predecessors).count = 0;
  (this->predecessors).max = 4;
  (this->successors).allocator = allocator;
  (this->successors).data = (this->successors).little;
  (this->successors).count = 0;
  (this->successors).max = 4;
  (this->dominanceFrontier).allocator = allocator;
  (this->dominanceFrontier).data = (this->dominanceFrontier).little;
  (this->dominanceFrontier).count = 0;
  (this->dominanceFrontier).max = 4;
  (this->dominanceChildren).allocator = allocator;
  (this->dominanceChildren).data = (this->dominanceChildren).little;
  (this->dominanceChildren).count = 0;
  (this->dominanceChildren).max = 4;
  (this->liveIn).allocator = allocator;
  (this->liveIn).data = (this->liveIn).little;
  (this->liveIn).max = 4;
  (this->liveIn).count = 0;
  (this->liveOut).allocator = allocator;
  (this->liveOut).data = (this->liveOut).little;
  (this->liveOut).count = 0;
  (this->liveOut).max = 4;
  this->lastInstruction = (VmInstruction *)0x0;
  this->insertPoint = (VmInstruction *)0x0;
  this->nextSibling = (VmBlock *)0x0;
  this->firstInstruction = (VmInstruction *)0x0;
  this->parent = (VmFunction *)0x0;
  this->prevSibling = (VmBlock *)0x0;
  this->address = 0xffffffff;
  this->visited = false;
  this->controlGraphPreOrderId = 0xffffffff;
  this->controlGraphPostOrderId = 0xffffffff;
  this->dominanceGraphPreOrderId = 0xffffffff;
  this->dominanceGraphPostOrderId = 0xffffffff;
  this->idom = (VmBlock *)0x0;
  this->hasAssignmentForId = 0;
  this->hasPhiNodeForId = 0;
  this->entryPc = (VmInstruction *)0x0;
  this->exitPc = (VmInstruction *)0x0;
  return;
}

Assistant:

VmBlock(Allocator *allocator, SynBase *source, InplaceStr name, unsigned uniqueId): VmValue(myTypeID, allocator, VmType::Block, source), name(name), uniqueId(uniqueId), predecessors(allocator), successors(allocator), dominanceFrontier(allocator), dominanceChildren(allocator), liveIn(allocator), liveOut(allocator)
	{
		parent = NULL;

		prevSibling = NULL;
		nextSibling = NULL;

		firstInstruction = NULL;
		lastInstruction = NULL;

		insertPoint = NULL;

		address = ~0u;

		visited = false;

		controlGraphPreOrderId = ~0u;
		controlGraphPostOrderId = ~0u;

		dominanceGraphPreOrderId = ~0u;
		dominanceGraphPostOrderId = ~0u;

		idom = NULL;

		hasAssignmentForId = 0;
		hasPhiNodeForId = 0;

		entryPc = NULL;
		exitPc = NULL;
	}